

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O1

Vec_Int_t * Ivy_ManLatches(Ivy_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = p->nObjs[4];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      piVar2 = (int *)pVVar3->pArray[lVar5];
      if ((piVar2 != (int *)0x0) && ((piVar2[2] & 0xfU) == 4)) {
        Vec_IntPush(p_00,*piVar2);
      }
      lVar5 = lVar5 + 1;
      pVVar3 = p->vObjs;
    } while (lVar5 < pVVar3->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Ivy_ManLatches( Ivy_Man_t * p )
{
    Vec_Int_t * vLatches;
    Ivy_Obj_t * pObj;
    int i;
    vLatches = Vec_IntAlloc( Ivy_ManLatchNum(p) );
    Ivy_ManForEachLatch( p, pObj, i )
        Vec_IntPush( vLatches, pObj->Id );
    return vLatches;
}